

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void loadFunction(LoadState *S,Proto *f)

{
  TString *pTVar1;
  TString **ppTVar2;
  lu_byte lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Instruction *pIVar8;
  TValue *pTVar9;
  Upvaldesc *pUVar10;
  Proto **ppPVar11;
  Proto *pPVar12;
  ls_byte *plVar13;
  AbsLineInfo *pAVar14;
  LocVar *pLVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 local_48;
  LoadState *local_40;
  TString **local_38;
  
  pPVar12 = f;
  iVar5 = loadInt(S);
  uVar6 = (uint)pPVar12;
  f->linedefined = iVar5;
  iVar5 = loadInt(S);
  f->lastlinedefined = iVar5;
  lVar3 = loadByte(S);
  f->numparams = lVar3;
  bVar4 = loadByte(S);
  f->flag = bVar4 & 1;
  if (S->fixed != '\0') {
    f->flag = bVar4 & 1 | 2;
  }
  lVar3 = loadByte(S);
  f->maxstacksize = lVar3;
  iVar5 = loadInt(S);
  loadAlign(S,uVar6);
  if (S->fixed == '\0') {
    sVar16 = (long)iVar5 << 2;
    pIVar8 = (Instruction *)luaM_malloc_(S->L,sVar16,0);
    f->code = pIVar8;
    f->sizecode = iVar5;
    loadBlock(S,pIVar8,sVar16);
  }
  else {
    pIVar8 = (Instruction *)getaddr_(S,(long)iVar5 << 2);
    f->code = pIVar8;
    f->sizecode = iVar5;
  }
  uVar6 = loadInt(S);
  uVar17 = 0;
  pTVar9 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar6 << 4,0);
  f->k = pTVar9;
  f->sizek = uVar6;
  uVar18 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar18 = uVar17;
  }
  for (; uVar18 * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
    (&pTVar9->tt_)[uVar17] = '\0';
  }
  local_38 = &f->source;
  uVar17 = 0;
  local_40 = S;
  do {
    if (uVar18 * 0x10 == uVar17) {
      uVar6 = loadInt(S);
      uVar17 = 0;
      pUVar10 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar6 << 4,0);
      ppTVar2 = local_38;
      f->upvalues = pUVar10;
      f->sizeupvalues = uVar6;
      uVar18 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar18 * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
        *(undefined8 *)((long)&pUVar10->name + uVar17) = 0;
      }
      for (uVar17 = 0; uVar18 * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
        lVar3 = loadByte(S);
        (&f->upvalues->instack)[uVar17] = lVar3;
        lVar3 = loadByte(S);
        (&f->upvalues->idx)[uVar17] = lVar3;
        lVar3 = loadByte(S);
        (&f->upvalues->kind)[uVar17] = lVar3;
      }
      uVar6 = loadInt(S);
      uVar17 = 0;
      ppPVar11 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar6 * 8,0);
      f->p = ppPVar11;
      f->sizep = uVar6;
      uVar18 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        f->p[uVar17] = (Proto *)0x0;
      }
      for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        pPVar12 = luaF_newproto(S->L);
        f->p[uVar17] = pPVar12;
        ppPVar11 = f->p;
        if (((f->marked & 0x20) != 0) && ((ppPVar11[uVar17]->marked & 0x18) != 0)) {
          luaC_barrier_(S->L,(GCObject *)f,(GCObject *)ppPVar11[uVar17]);
          ppPVar11 = f->p;
        }
        loadFunction(S,ppPVar11[uVar17]);
      }
      loadString(S,f,ppTVar2);
      iVar5 = loadInt(S);
      if (S->fixed == '\0') {
        plVar13 = (ls_byte *)luaM_malloc_(S->L,(long)iVar5,0);
        f->lineinfo = plVar13;
        f->sizelineinfo = iVar5;
        loadBlock(S,plVar13,(long)iVar5);
        uVar6 = (uint)plVar13;
      }
      else {
        sVar16 = (size_t)iVar5;
        plVar13 = (ls_byte *)getaddr_(S,sVar16);
        uVar6 = (uint)sVar16;
        f->lineinfo = plVar13;
        f->sizelineinfo = iVar5;
      }
      uVar7 = loadInt(S);
      if (0 < (int)uVar7) {
        loadAlign(S,uVar6);
        if (S->fixed == '\0') {
          pAVar14 = (AbsLineInfo *)luaM_malloc_(S->L,(ulong)uVar7 << 3,0);
          f->abslineinfo = pAVar14;
          f->sizeabslineinfo = uVar7;
          loadBlock(S,pAVar14,(ulong)uVar7 << 3);
        }
        else {
          pAVar14 = (AbsLineInfo *)getaddr_(S,(ulong)uVar7 << 3);
          f->abslineinfo = pAVar14;
          f->sizeabslineinfo = uVar7;
        }
      }
      uVar6 = loadInt(S);
      uVar17 = 0;
      pLVar15 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar6 << 4,0);
      f->locvars = pLVar15;
      f->sizelocvars = uVar6;
      uVar18 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar18 * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
        *(undefined8 *)((long)&pLVar15->varname + uVar17) = 0;
      }
      for (uVar17 = 0; uVar18 * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
        loadString(S,f,(TString **)((long)&pLVar15->varname + uVar17));
        iVar5 = loadInt(S);
        *(int *)((long)&f->locvars->startpc + uVar17) = iVar5;
        iVar5 = loadInt(S);
        pLVar15 = f->locvars;
        *(int *)((long)&pLVar15->endpc + uVar17) = iVar5;
      }
      iVar5 = loadInt(S);
      uVar18 = 0;
      uVar6 = 0;
      if (iVar5 != 0) {
        uVar6 = f->sizeupvalues;
      }
      uVar17 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar17 = uVar18;
      }
      for (; uVar17 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
        loadString(S,f,(TString **)((long)&f->upvalues->name + uVar18));
      }
      return;
    }
    pTVar9 = f->k;
    lVar3 = loadByte(S);
    ppTVar2 = local_38;
    switch(lVar3) {
    case '\0':
      (&pTVar9->tt_)[uVar17] = '\0';
      break;
    case '\x01':
      (&pTVar9->tt_)[uVar17] = '\x01';
      break;
    case '\x02':
      break;
    case '\x03':
      loadBlock(S,&local_48,8);
      *(undefined8 *)((long)&pTVar9->value_ + uVar17) = local_48;
      (&pTVar9->tt_)[uVar17] = '\x03';
      break;
    case '\x04':
switchD_0011b0ce_caseD_4:
      loadString(S,f,local_38);
      pTVar1 = f->source;
      if (pTVar1 == (TString *)0x0) {
        error(local_40,"bad format for constant string");
      }
      *(TString **)((long)&pTVar9->value_ + uVar17) = pTVar1;
      (&pTVar9->tt_)[uVar17] = pTVar1->tt | 0x40;
      *ppTVar2 = (TString *)0x0;
      S = local_40;
      break;
    default:
      if (lVar3 == '\x11') {
        (&pTVar9->tt_)[uVar17] = '\x11';
      }
      else if (lVar3 == '\x13') {
        loadBlock(S,&local_48,8);
        *(undefined8 *)((long)&pTVar9->value_ + uVar17) = local_48;
        (&pTVar9->tt_)[uVar17] = '\x13';
      }
      else if (lVar3 == '\x14') goto switchD_0011b0ce_caseD_4;
    }
    uVar17 = uVar17 + 0x10;
  } while( true );
}

Assistant:

static void loadFunction (LoadState *S, Proto *f) {
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->flag = loadByte(S) & PF_ISVARARG;  /* get only the meaningful flags */
  if (S->fixed)
    f->flag |= PF_FIXED;  /* signal that code is fixed */
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadString(S, f, &f->source);
  loadDebug(S, f);
}